

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O0

void duckdb::Node48::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  Node48 *art_00;
  byte in_DL;
  Node *in_RSI;
  Node *in_RDI;
  ART *unaff_retaddr;
  Node node48;
  Node48 *n48;
  undefined8 in_stack_ffffffffffffffd0;
  ART *art_01;
  Node in_stack_ffffffffffffffe0;
  
  art_01 = (ART *)(in_RSI->super_IndexPointer).data;
  art_00 = Node::Ref<duckdb::Node48>
                     (art_01,in_stack_ffffffffffffffe0,
                      (NType)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
  Node::Free((ART *)art_00,(Node *)art_01);
  art_00->child_index[in_DL] = '0';
  art_00->count = art_00->count + 0xff;
  if (art_00->count < 0xc) {
    Node16::ShrinkNode48(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void Node48::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// Free the child and decrease the count.
	Node::Free(art, n48.children[n48.child_index[byte]]);
	n48.child_index[byte] = EMPTY_MARKER;
	n48.count--;

	// Shrink to Node16.
	if (n48.count < SHRINK_THRESHOLD) {
		auto node48 = node;
		Node16::ShrinkNode48(art, node, node48);
	}
}